

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editordetector.cpp
# Opt level: O2

QString * findInPath(QString *__return_storage_ptr__,QString *fileName)

{
  char cVar1;
  long lVar2;
  QString *pQVar3;
  QFileInfo fileInfo;
  QStringList paths;
  QString path_;
  QString path;
  
  qgetenv((char *)&paths);
  QString::fromLocal8Bit<void>(&path,(QByteArray *)&paths);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&paths);
  QString::split(&paths,&path,0x3a,0,1);
  lVar2 = paths.d.size * 0x18;
  pQVar3 = paths.d.ptr;
  do {
    if (lVar2 == 0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
LAB_00128985:
      QArrayDataPointer<QString>::~QArrayDataPointer(&paths.d);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&path.d);
      return __return_storage_ptr__;
    }
    QDir::QDir((QDir *)&fileInfo,(QString *)pQVar3);
    QDir::filePath((QString *)&path_.d);
    QDir::~QDir((QDir *)&fileInfo);
    QFileInfo::QFileInfo(&fileInfo,(QString *)&path_.d);
    cVar1 = QFileInfo::exists();
    if (cVar1 != '\0') {
      cVar1 = QFileInfo::isFile();
      if (cVar1 != '\0') {
        cVar1 = QFileInfo::isExecutable();
        if (cVar1 != '\0') {
          QDir::toNativeSeparators((QString *)__return_storage_ptr__);
          QFileInfo::~QFileInfo(&fileInfo);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&path_.d);
          goto LAB_00128985;
        }
      }
    }
    QFileInfo::~QFileInfo(&fileInfo);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&path_.d);
    pQVar3 = pQVar3 + 1;
    lVar2 = lVar2 + -0x18;
  } while( true );
}

Assistant:

QString findInPath(const QString &fileName)
{
    const QString path = QString::fromLocal8Bit(qgetenv("PATH"));
#if defined(Q_OS_WIN32)
    QLatin1Char separator(';');
#else
    QLatin1Char separator(':');
#endif

    const QStringList paths = path.split(separator);
    for (const QString &path : paths) {
        QString path_ = QDir(path).filePath(fileName);
        QFileInfo fileInfo(path_);
        if (fileInfo.exists() && fileInfo.isFile() && fileInfo.isExecutable())
            return QDir::toNativeSeparators(path_);
    }

    return QString();
}